

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O0

void __thiscall QRestReply::~QRestReply(QRestReply *this)

{
  void *pvVar1;
  long in_RDI;
  
  pvVar1 = *(void **)(in_RDI + 0x10);
  if (pvVar1 != (void *)0x0) {
    QRestReplyPrivate::~QRestReplyPrivate((QRestReplyPrivate *)0x33385f);
    operator_delete(pvVar1,0x40);
  }
  QPointer<QNetworkReply>::~QPointer((QPointer<QNetworkReply> *)0x333877);
  return;
}

Assistant:

QRestReply::~QRestReply()
{
    delete d;
}